

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O2

int amqp_table_clone(amqp_table_t *original,amqp_table_t *clone,amqp_pool_t *pool)

{
  size_t amount;
  amqp_table_entry_t_ *paVar1;
  void *__dest;
  int iVar2;
  amqp_table_entry_t_ *paVar3;
  long lVar4;
  long lVar5;
  
  iVar2 = original->num_entries;
  clone->num_entries = iVar2;
  if ((long)iVar2 == 0) {
    clone->num_entries = 0;
    *(undefined4 *)&clone->field_0x4 = 0;
    clone->entries = (amqp_table_entry_t_ *)0x0;
LAB_00109f16:
    iVar2 = 0;
  }
  else {
    paVar3 = (amqp_table_entry_t_ *)amqp_pool_alloc(pool,(long)iVar2 * 0x28);
    clone->entries = paVar3;
    iVar2 = -1;
    if (paVar3 != (amqp_table_entry_t_ *)0x0) {
      lVar4 = -1;
      lVar5 = 0x10;
      do {
        lVar4 = lVar4 + 1;
        if (clone->num_entries <= lVar4) goto LAB_00109f16;
        paVar3 = original->entries;
        amount = *(size_t *)((long)paVar3 + lVar5 + -0x10);
        if (amount == 0) {
          return -10;
        }
        paVar1 = clone->entries;
        amqp_pool_alloc_bytes(pool,amount,(amqp_bytes_t *)((long)paVar1 + lVar5 + -0x10));
        __dest = *(void **)((long)paVar1 + lVar5 + -8);
        if (__dest == (void *)0x0) {
          return -1;
        }
        memcpy(__dest,*(void **)((long)paVar3 + lVar5 + -8),
               *(size_t *)((long)paVar1 + lVar5 + -0x10));
        iVar2 = amqp_field_value_clone
                          ((amqp_field_value_t *)((long)&(paVar3->key).len + lVar5),
                           (amqp_field_value_t *)((long)&(paVar1->key).len + lVar5),pool);
        lVar5 = lVar5 + 0x28;
      } while (iVar2 == 0);
    }
  }
  return iVar2;
}

Assistant:

int amqp_table_clone(const amqp_table_t *original, amqp_table_t *clone,
                     amqp_pool_t *pool) {
  int i;
  int res;
  clone->num_entries = original->num_entries;
  if (0 == clone->num_entries) {
    *clone = amqp_empty_table;
    return AMQP_STATUS_OK;
  }

  clone->entries =
      amqp_pool_alloc(pool, clone->num_entries * sizeof(amqp_table_entry_t));

  if (NULL == clone->entries) {
    return AMQP_STATUS_NO_MEMORY;
  }

  for (i = 0; i < clone->num_entries; ++i) {
    res =
        amqp_table_entry_clone(&original->entries[i], &clone->entries[i], pool);
    if (AMQP_STATUS_OK != res) {
      goto error_out1;
    }
  }

  return AMQP_STATUS_OK;

error_out1:
  return res;
}